

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeSet::applyPattern
          (UnicodeSet *this,RuleCharacterIterator *chars,SymbolTable *symbols,
          UnicodeString *rebuiltPat,uint32_t options,offset_in_UnicodeSet_to_subr caseClosure,
          int32_t depth,UErrorCode *ec)

{
  bool bVar1;
  char16_t cVar2;
  UBool UVar3;
  int iVar4;
  int32_t iVar5;
  undefined4 extraout_var;
  long *plVar6;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong __length;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined4 in_stack_0000000c;
  UErrorCode *in_stack_00000018;
  code *local_210;
  code *local_1f8;
  UnicodeSet *local_1a0;
  UBool anchor;
  UBool ok;
  code *local_138;
  UErrorCode *pUStack_130;
  UnicodeSet *local_128;
  UnicodeSet *ms;
  UnicodeFunctor *m;
  UnicodeSet *pUStack_110;
  int8_t setMode;
  UnicodeSet *nested;
  int local_100;
  char local_fb;
  char16_t cStack_fa;
  UBool literal;
  UChar32 c;
  UBool invert;
  UChar op;
  UChar32 lastChar;
  int8_t mode;
  int8_t lastItem;
  Pos backup;
  UnicodeSetPointer scratch;
  UBool usePat;
  undefined1 local_c8 [8];
  UnicodeString buf;
  UnicodeString patLocal;
  int32_t opts;
  int32_t depth_local;
  offset_in_UnicodeSet_to_subr caseClosure_local;
  uint32_t options_local;
  UnicodeString *rebuiltPat_local;
  SymbolTable *symbols_local;
  RuleCharacterIterator *chars_local;
  UnicodeSet *this_local;
  
  local_210 = (code *)CONCAT44(in_stack_0000000c,depth);
  UVar3 = ::U_FAILURE(*in_stack_00000018);
  if (UVar3 == '\0') {
    if ((int)caseClosure < 0x65) {
      patLocal.fUnion._48_4_ = 3;
      if ((options & 1) != 0) {
        patLocal.fUnion._48_4_ = 7;
      }
      UnicodeString::UnicodeString((UnicodeString *)((long)&buf.fUnion + 0x30));
      UnicodeString::UnicodeString((UnicodeString *)local_c8);
      bVar1 = false;
      anon_unknown_0::UnicodeSetPointer::UnicodeSetPointer((UnicodeSetPointer *)&backup.pos);
      op._1_1_ = '\0';
      op._0_1_ = '\0';
      c = 0;
      cStack_fa = L'\0';
      local_fb = '\0';
      clear(this);
      cVar2 = cStack_fa;
LAB_00387f70:
      do {
        cStack_fa = cVar2;
        bVar7 = false;
        if ((char)op != '\x02') {
          UVar3 = RuleCharacterIterator::atEnd(chars);
          bVar7 = UVar3 == '\0';
        }
        if (!bVar7) {
LAB_00388d3e:
          if ((char)op == '\x02') {
            RuleCharacterIterator::skipIgnored(chars,patLocal.fUnion._48_4_);
            if ((options & 2) == 0) {
              if ((options & 4) != 0) {
                plVar6 = (long *)((long)&(this->super_UnicodeFilter).super_UnicodeFunctor.
                                         super_UObject._vptr_UObject + (long)ec);
                if ((depth & 1U) != 0) {
                  local_210 = *(code **)(local_210 + *plVar6 + -1);
                }
                (*local_210)(plVar6,4);
              }
            }
            else {
              plVar6 = (long *)((long)&(this->super_UnicodeFilter).super_UnicodeFunctor.
                                       super_UObject._vptr_UObject + (long)ec);
              local_1f8 = local_210;
              if ((depth & 1U) != 0) {
                local_1f8 = *(code **)(local_210 + *plVar6 + -1);
              }
              (*local_1f8)(plVar6,2);
            }
            if (local_fb != '\0') {
              complement(this);
            }
            if (bVar1) {
              UnicodeString::append(rebuiltPat,(UnicodeString *)((long)&buf.fUnion + 0x30));
            }
            else {
              _generatePattern(this,rebuiltPat,'\0');
            }
            UVar3 = isBogus(this);
            if ((UVar3 != '\0') && (UVar3 = ::U_SUCCESS(*in_stack_00000018), UVar3 != '\0')) {
              *in_stack_00000018 = U_MEMORY_ALLOCATION_ERROR;
            }
            m._0_4_ = 0;
          }
          else {
            *in_stack_00000018 = U_MALFORMED_SET;
            m._0_4_ = 1;
          }
          goto LAB_00388f0a;
        }
        local_100 = 0;
        nested._7_1_ = '\0';
        pUStack_110 = (UnicodeSet *)0x0;
        m._7_1_ = '\0';
        UVar3 = resemblesPropertyPattern(chars,patLocal.fUnion._48_4_);
        if (UVar3 == '\0') {
          RuleCharacterIterator::getPos(chars,(Pos *)&lastChar);
          local_100 = RuleCharacterIterator::next
                                (chars,patLocal.fUnion._48_4_,(UBool *)((long)&nested + 7),
                                 in_stack_00000018);
          UVar3 = ::U_FAILURE(*in_stack_00000018);
          if (UVar3 != '\0') {
            m._0_4_ = 1;
            goto LAB_00388f0a;
          }
          if ((local_100 == 0x5b) && (nested._7_1_ == '\0')) {
            if ((char)op == '\x01') {
              RuleCharacterIterator::setPos(chars,(Pos *)&lastChar);
              m._7_1_ = '\x01';
              __length = extraout_RDX_01;
            }
            else {
              op._0_1_ = '\x01';
              UnicodeString::append((UnicodeString *)((long)&buf.fUnion + 0x30),L'[');
              RuleCharacterIterator::getPos(chars,(Pos *)&lastChar);
              local_100 = RuleCharacterIterator::next
                                    (chars,patLocal.fUnion._48_4_,(UBool *)((long)&nested + 7),
                                     in_stack_00000018);
              UVar3 = ::U_FAILURE(*in_stack_00000018);
              if (UVar3 != '\0') {
                m._0_4_ = 1;
                goto LAB_00388f0a;
              }
              __length = extraout_RDX_02;
              if ((local_100 == 0x5e) && (nested._7_1_ == '\0')) {
                local_fb = '\x01';
                UnicodeString::append((UnicodeString *)((long)&buf.fUnion + 0x30),L'^');
                RuleCharacterIterator::getPos(chars,(Pos *)&lastChar);
                local_100 = RuleCharacterIterator::next
                                      (chars,patLocal.fUnion._48_4_,(UBool *)((long)&nested + 7),
                                       in_stack_00000018);
                UVar3 = ::U_FAILURE(*in_stack_00000018);
                __length = extraout_RDX_03;
                if (UVar3 != '\0') {
                  m._0_4_ = 1;
                  goto LAB_00388f0a;
                }
              }
              if (local_100 != 0x2d) {
                RuleCharacterIterator::setPos(chars,(Pos *)&lastChar);
                cVar2 = cStack_fa;
                goto LAB_00387f70;
              }
              nested._7_1_ = '\x01';
            }
          }
          else {
            __length = extraout_RDX_00;
            if (symbols != (SymbolTable *)0x0) {
              iVar4 = (*symbols->_vptr_SymbolTable[3])();
              ms = (UnicodeSet *)CONCAT44(extraout_var,iVar4);
              __length = extraout_RDX_04;
              if (ms != (UnicodeSet *)0x0) {
                if (ms == (UnicodeSet *)0x0) {
                  auVar8._8_8_ = 0;
                  auVar8._0_8_ = extraout_RDX_04;
                  auVar8 = auVar8 << 0x40;
                }
                else {
                  auVar8 = __dynamic_cast(ms,&UnicodeFunctor::typeinfo,&typeinfo,0);
                }
                __length = auVar8._8_8_;
                local_1a0 = auVar8._0_8_;
                local_128 = local_1a0;
                if (local_1a0 == (UnicodeSet *)0x0) {
                  *in_stack_00000018 = U_MALFORMED_SET;
                  m._0_4_ = 1;
                  goto LAB_00388f0a;
                }
                pUStack_110 = local_1a0;
                m._7_1_ = '\x03';
              }
            }
          }
        }
        else {
          m._7_1_ = '\x02';
          __length = extraout_RDX;
        }
        if (m._7_1_ != '\0') {
          if (op._1_1_ == '\x01') {
            if (cStack_fa != L'\0') {
              *in_stack_00000018 = U_MALFORMED_SET;
              m._0_4_ = 1;
              goto LAB_00388f0a;
            }
            add(this,c,c);
            _appendToPat((UnicodeString *)((long)&buf.fUnion + 0x30),c,'\0');
            op._1_1_ = '\0';
            cStack_fa = L'\0';
          }
          if ((cStack_fa == L'-') || (cStack_fa == L'&')) {
            UnicodeString::append((UnicodeString *)((long)&buf.fUnion + 0x30),cStack_fa);
          }
          if (pUStack_110 == (UnicodeSet *)0x0) {
            UVar3 = anon_unknown_0::UnicodeSetPointer::allocate((UnicodeSetPointer *)&backup.pos);
            if (UVar3 == '\0') {
              *in_stack_00000018 = U_MEMORY_ALLOCATION_ERROR;
              m._0_4_ = 1;
              goto LAB_00388f0a;
            }
            pUStack_110 = anon_unknown_0::UnicodeSetPointer::pointer
                                    ((UnicodeSetPointer *)&backup.pos);
          }
          if (m._7_1_ == '\x01') {
            pUStack_130 = ec;
            local_138 = local_210;
            applyPattern(pUStack_110,chars,symbols,(UnicodeString *)((long)&buf.fUnion + 0x30),
                         options,(ulong)((int)caseClosure + 1),depth,ec);
          }
          else if (m._7_1_ == '\x02') {
            RuleCharacterIterator::skipIgnored(chars,patLocal.fUnion._48_4_);
            applyPropertyPattern
                      (pUStack_110,chars,(UnicodeString *)((long)&buf.fUnion + 0x30),
                       in_stack_00000018);
            UVar3 = ::U_FAILURE(*in_stack_00000018);
            if (UVar3 != '\0') {
              m._0_4_ = 1;
              goto LAB_00388f0a;
            }
          }
          else if (m._7_1_ == '\x03') {
            _toPattern(pUStack_110,(UnicodeString *)((long)&buf.fUnion + 0x30),'\0');
          }
          bVar1 = true;
          if ((char)op == '\0') {
            operator=(this,pUStack_110);
            op._0_1_ = '\x02';
            goto LAB_00388d3e;
          }
          if (cStack_fa == L'\0') {
            addAll(this,pUStack_110);
          }
          else if (cStack_fa == L'&') {
            retainAll(this,pUStack_110);
          }
          else if (cStack_fa == L'-') {
            removeAll(this,pUStack_110);
          }
          cStack_fa = L'\0';
          op._1_1_ = '\x02';
          cVar2 = cStack_fa;
          goto LAB_00387f70;
        }
        if ((char)op == '\0') {
          *in_stack_00000018 = U_MALFORMED_SET;
          m._0_4_ = 1;
          goto LAB_00388f0a;
        }
        if (nested._7_1_ != '\0') {
LAB_00388be3:
          cVar2 = cStack_fa;
          if (op._1_1_ == '\0') {
            op._1_1_ = '\x01';
            c = local_100;
          }
          else if (op._1_1_ == '\x01') {
            if (cStack_fa == L'-') {
              if (local_100 <= c) {
                *in_stack_00000018 = U_MALFORMED_SET;
                m._0_4_ = 1;
                goto LAB_00388f0a;
              }
              add(this,c,local_100);
              _appendToPat((UnicodeString *)((long)&buf.fUnion + 0x30),c,'\0');
              UnicodeString::append((UnicodeString *)((long)&buf.fUnion + 0x30),cStack_fa);
              _appendToPat((UnicodeString *)((long)&buf.fUnion + 0x30),local_100,'\0');
              op._1_1_ = '\0';
              cStack_fa = L'\0';
              cVar2 = cStack_fa;
            }
            else {
              add(this,c,c);
              _appendToPat((UnicodeString *)((long)&buf.fUnion + 0x30),c,'\0');
              c = local_100;
              cVar2 = cStack_fa;
            }
          }
          else if (op._1_1_ == '\x02') {
            if (cStack_fa != L'\0') {
              *in_stack_00000018 = U_MALFORMED_SET;
              m._0_4_ = 1;
              goto LAB_00388f0a;
            }
            c = local_100;
            op._1_1_ = '\x01';
          }
          goto LAB_00387f70;
        }
        if (local_100 == 0x24) {
          RuleCharacterIterator::getPos(chars,(Pos *)&lastChar);
          local_100 = RuleCharacterIterator::next
                                (chars,patLocal.fUnion._48_4_,(UBool *)((long)&nested + 7),
                                 in_stack_00000018);
          UVar3 = ::U_FAILURE(*in_stack_00000018);
          if (UVar3 != '\0') {
            m._0_4_ = 1;
            goto LAB_00388f0a;
          }
          if ((symbols == (SymbolTable *)0x0) && (local_100 != 0x5d || nested._7_1_ != '\0')) {
            local_100 = 0x24;
            RuleCharacterIterator::setPos(chars,(Pos *)&lastChar);
            goto LAB_00388be3;
          }
          if ((local_100 != 0x5d || nested._7_1_ != '\0') || (cStack_fa != L'\0')) {
            *in_stack_00000018 = U_MALFORMED_SET;
            m._0_4_ = 1;
            goto LAB_00388f0a;
          }
          if (op._1_1_ == '\x01') {
            add(this,c,c);
            _appendToPat((UnicodeString *)((long)&buf.fUnion + 0x30),c,'\0');
          }
          add(this,0xffff);
          bVar1 = true;
          UnicodeString::append((UnicodeString *)((long)&buf.fUnion + 0x30),L'$');
          UnicodeString::append((UnicodeString *)((long)&buf.fUnion + 0x30),L']');
          op._0_1_ = '\x02';
          cVar2 = cStack_fa;
          goto LAB_00387f70;
        }
        cVar2 = (char16_t)local_100;
        if (local_100 != 0x26) {
          if (local_100 != 0x2d) {
            if (local_100 == 0x5d) {
              if (op._1_1_ == '\x01') {
                add(this,c,c);
                _appendToPat((UnicodeString *)((long)&buf.fUnion + 0x30),c,'\0');
              }
              if (cStack_fa == L'-') {
                add(this,0x2d,0x2d);
                UnicodeString::append((UnicodeString *)((long)&buf.fUnion + 0x30),cStack_fa);
              }
              else if (cStack_fa == L'&') {
                *in_stack_00000018 = U_MALFORMED_SET;
                m._0_4_ = 1;
                goto LAB_00388f0a;
              }
              UnicodeString::append((UnicodeString *)((long)&buf.fUnion + 0x30),L']');
              op._0_1_ = '\x02';
              cVar2 = cStack_fa;
            }
            else {
              if (local_100 == 0x5e) {
                *in_stack_00000018 = U_MALFORMED_SET;
                m._0_4_ = 1;
                goto LAB_00388f0a;
              }
              if (local_100 != 0x7b) goto LAB_00388be3;
              if (cStack_fa != L'\0') {
                *in_stack_00000018 = U_MALFORMED_SET;
                m._0_4_ = 1;
                goto LAB_00388f0a;
              }
              if (op._1_1_ == '\x01') {
                add(this,c,c);
                _appendToPat((UnicodeString *)((long)&buf.fUnion + 0x30),c,'\0');
                __length = extraout_RDX_05;
              }
              op._1_1_ = '\0';
              UnicodeString::truncate((UnicodeString *)local_c8,(char *)0x0,__length);
              bVar7 = false;
              while (UVar3 = RuleCharacterIterator::atEnd(chars), UVar3 == '\0') {
                local_100 = RuleCharacterIterator::next
                                      (chars,patLocal.fUnion._48_4_,(UBool *)((long)&nested + 7),
                                       in_stack_00000018);
                UVar3 = ::U_FAILURE(*in_stack_00000018);
                if (UVar3 != '\0') {
                  m._0_4_ = 1;
                  goto LAB_00388f0a;
                }
                if ((local_100 == 0x7d) && (nested._7_1_ == '\0')) {
                  bVar7 = true;
                  break;
                }
                UnicodeString::append((UnicodeString *)local_c8,local_100);
              }
              iVar5 = UnicodeString::length((UnicodeString *)local_c8);
              if ((iVar5 < 1) || (!bVar7)) {
                *in_stack_00000018 = U_MALFORMED_SET;
                m._0_4_ = 1;
                goto LAB_00388f0a;
              }
              add(this,(UnicodeString *)local_c8);
              UnicodeString::append((UnicodeString *)((long)&buf.fUnion + 0x30),L'{');
              _appendToPat((UnicodeString *)((long)&buf.fUnion + 0x30),(UnicodeString *)local_c8,
                           '\0');
              UnicodeString::append((UnicodeString *)((long)&buf.fUnion + 0x30),L'}');
              cVar2 = cStack_fa;
            }
            goto LAB_00387f70;
          }
          if (cStack_fa == L'\0') {
            if (op._1_1_ != '\0') goto LAB_00387f70;
            add(this,0x2d,0x2d);
            local_100 = RuleCharacterIterator::next
                                  (chars,patLocal.fUnion._48_4_,(UBool *)((long)&nested + 7),
                                   in_stack_00000018);
            UVar3 = ::U_FAILURE(*in_stack_00000018);
            if (UVar3 != '\0') {
              m._0_4_ = 1;
              goto LAB_00388f0a;
            }
            if ((local_100 == 0x5d) && (nested._7_1_ == '\0')) {
              ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffec0,L"-]");
              UnicodeString::append
                        ((UnicodeString *)((long)&buf.fUnion + 0x30),
                         (ConstChar16Ptr *)&stack0xfffffffffffffec0,2);
              ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffec0);
              op._0_1_ = '\x02';
              cVar2 = cStack_fa;
              goto LAB_00387f70;
            }
          }
          *in_stack_00000018 = U_MALFORMED_SET;
          m._0_4_ = 1;
          goto LAB_00388f0a;
        }
        if ((op._1_1_ != '\x02') || (cStack_fa != L'\0')) {
          *in_stack_00000018 = U_MALFORMED_SET;
          m._0_4_ = 1;
LAB_00388f0a:
          anon_unknown_0::UnicodeSetPointer::~UnicodeSetPointer((UnicodeSetPointer *)&backup.pos);
          UnicodeString::~UnicodeString((UnicodeString *)local_c8);
          UnicodeString::~UnicodeString((UnicodeString *)((long)&buf.fUnion + 0x30));
          return;
        }
      } while( true );
    }
    *in_stack_00000018 = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return;
}

Assistant:

void UnicodeSet::applyPattern(RuleCharacterIterator& chars,
                              const SymbolTable* symbols,
                              UnicodeString& rebuiltPat,
                              uint32_t options,
                              UnicodeSet& (UnicodeSet::*caseClosure)(int32_t attribute),
                              int32_t depth,
                              UErrorCode& ec) {
    if (U_FAILURE(ec)) return;
    if (depth > MAX_DEPTH) {
        ec = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    // Syntax characters: [ ] ^ - & { }

    // Recognized special forms for chars, sets: c-c s-s s&s

    int32_t opts = RuleCharacterIterator::PARSE_VARIABLES |
                   RuleCharacterIterator::PARSE_ESCAPES;
    if ((options & USET_IGNORE_SPACE) != 0) {
        opts |= RuleCharacterIterator::SKIP_WHITESPACE;
    }

    UnicodeString patLocal, buf;
    UBool usePat = FALSE;
    UnicodeSetPointer scratch;
    RuleCharacterIterator::Pos backup;

    // mode: 0=before [, 1=between [...], 2=after ]
    // lastItem: 0=none, 1=char, 2=set
    int8_t lastItem = 0, mode = 0;
    UChar32 lastChar = 0;
    UChar op = 0;

    UBool invert = FALSE;

    clear();

    while (mode != 2 && !chars.atEnd()) {
        U_ASSERT((lastItem == 0 && op == 0) ||
                 (lastItem == 1 && (op == 0 || op == HYPHEN /*'-'*/)) ||
                 (lastItem == 2 && (op == 0 || op == HYPHEN /*'-'*/ ||
                                    op == INTERSECTION /*'&'*/)));

        UChar32 c = 0;
        UBool literal = FALSE;
        UnicodeSet* nested = 0; // alias - do not delete

        // -------- Check for property pattern

        // setMode: 0=none, 1=unicodeset, 2=propertypat, 3=preparsed
        int8_t setMode = 0;
        if (resemblesPropertyPattern(chars, opts)) {
            setMode = 2;
        }

        // -------- Parse '[' of opening delimiter OR nested set.
        // If there is a nested set, use `setMode' to define how
        // the set should be parsed.  If the '[' is part of the
        // opening delimiter for this pattern, parse special
        // strings "[", "[^", "[-", and "[^-".  Check for stand-in
        // characters representing a nested set in the symbol
        // table.

        else {
            // Prepare to backup if necessary
            chars.getPos(backup);
            c = chars.next(opts, literal, ec);
            if (U_FAILURE(ec)) return;

            if (c == 0x5B /*'['*/ && !literal) {
                if (mode == 1) {
                    chars.setPos(backup); // backup
                    setMode = 1;
                } else {
                    // Handle opening '[' delimiter
                    mode = 1;
                    patLocal.append((UChar) 0x5B /*'['*/);
                    chars.getPos(backup); // prepare to backup
                    c = chars.next(opts, literal, ec); 
                    if (U_FAILURE(ec)) return;
                    if (c == 0x5E /*'^'*/ && !literal) {
                        invert = TRUE;
                        patLocal.append((UChar) 0x5E /*'^'*/);
                        chars.getPos(backup); // prepare to backup
                        c = chars.next(opts, literal, ec);
                        if (U_FAILURE(ec)) return;
                    }
                    // Fall through to handle special leading '-';
                    // otherwise restart loop for nested [], \p{}, etc.
                    if (c == HYPHEN /*'-'*/) {
                        literal = TRUE;
                        // Fall through to handle literal '-' below
                    } else {
                        chars.setPos(backup); // backup
                        continue;
                    }
                }
            } else if (symbols != 0) {
                const UnicodeFunctor *m = symbols->lookupMatcher(c);
                if (m != 0) {
                    const UnicodeSet *ms = dynamic_cast<const UnicodeSet *>(m);
                    if (ms == NULL) {
                        ec = U_MALFORMED_SET;
                        return;
                    }
                    // casting away const, but `nested' won't be modified
                    // (important not to modify stored set)
                    nested = const_cast<UnicodeSet*>(ms);
                    setMode = 3;
                }
            }
        }

        // -------- Handle a nested set.  This either is inline in
        // the pattern or represented by a stand-in that has
        // previously been parsed and was looked up in the symbol
        // table.

        if (setMode != 0) {
            if (lastItem == 1) {
                if (op != 0) {
                    // syntaxError(chars, "Char expected after operator");
                    ec = U_MALFORMED_SET;
                    return;
                }
                add(lastChar, lastChar);
                _appendToPat(patLocal, lastChar, FALSE);
                lastItem = 0;
                op = 0;
            }

            if (op == HYPHEN /*'-'*/ || op == INTERSECTION /*'&'*/) {
                patLocal.append(op);
            }

            if (nested == 0) {
                // lazy allocation
                if (!scratch.allocate()) {
                    ec = U_MEMORY_ALLOCATION_ERROR;
                    return;
                }
                nested = scratch.pointer();
            }
            switch (setMode) {
            case 1:
                nested->applyPattern(chars, symbols, patLocal, options, caseClosure, depth + 1, ec);
                break;
            case 2:
                chars.skipIgnored(opts);
                nested->applyPropertyPattern(chars, patLocal, ec);
                if (U_FAILURE(ec)) return;
                break;
            case 3: // `nested' already parsed
                nested->_toPattern(patLocal, FALSE);
                break;
            }

            usePat = TRUE;

            if (mode == 0) {
                // Entire pattern is a category; leave parse loop
                *this = *nested;
                mode = 2;
                break;
            }

            switch (op) {
            case HYPHEN: /*'-'*/
                removeAll(*nested);
                break;
            case INTERSECTION: /*'&'*/
                retainAll(*nested);
                break;
            case 0:
                addAll(*nested);
                break;
            }

            op = 0;
            lastItem = 2;

            continue;
        }

        if (mode == 0) {
            // syntaxError(chars, "Missing '['");
            ec = U_MALFORMED_SET;
            return;
        }

        // -------- Parse special (syntax) characters.  If the
        // current character is not special, or if it is escaped,
        // then fall through and handle it below.

        if (!literal) {
            switch (c) {
            case 0x5D /*']'*/:
                if (lastItem == 1) {
                    add(lastChar, lastChar);
                    _appendToPat(patLocal, lastChar, FALSE);
                }
                // Treat final trailing '-' as a literal
                if (op == HYPHEN /*'-'*/) {
                    add(op, op);
                    patLocal.append(op);
                } else if (op == INTERSECTION /*'&'*/) {
                    // syntaxError(chars, "Trailing '&'");
                    ec = U_MALFORMED_SET;
                    return;
                }
                patLocal.append((UChar) 0x5D /*']'*/);
                mode = 2;
                continue;
            case HYPHEN /*'-'*/:
                if (op == 0) {
                    if (lastItem != 0) {
                        op = (UChar) c;
                        continue;
                    } else {
                        // Treat final trailing '-' as a literal
                        add(c, c);
                        c = chars.next(opts, literal, ec);
                        if (U_FAILURE(ec)) return;
                        if (c == 0x5D /*']'*/ && !literal) {
                            patLocal.append(HYPHEN_RIGHT_BRACE, 2);
                            mode = 2;
                            continue;
                        }
                    }
                }
                // syntaxError(chars, "'-' not after char or set");
                ec = U_MALFORMED_SET;
                return;
            case INTERSECTION /*'&'*/:
                if (lastItem == 2 && op == 0) {
                    op = (UChar) c;
                    continue;
                }
                // syntaxError(chars, "'&' not after set");
                ec = U_MALFORMED_SET;
                return;
            case 0x5E /*'^'*/:
                // syntaxError(chars, "'^' not after '['");
                ec = U_MALFORMED_SET;
                return;
            case 0x7B /*'{'*/:
                if (op != 0) {
                    // syntaxError(chars, "Missing operand after operator");
                    ec = U_MALFORMED_SET;
                    return;
                }
                if (lastItem == 1) {
                    add(lastChar, lastChar);
                    _appendToPat(patLocal, lastChar, FALSE);
                }
                lastItem = 0;
                buf.truncate(0);
                {
                    UBool ok = FALSE;
                    while (!chars.atEnd()) {
                        c = chars.next(opts, literal, ec);
                        if (U_FAILURE(ec)) return;
                        if (c == 0x7D /*'}'*/ && !literal) {
                            ok = TRUE;
                            break;
                        }
                        buf.append(c);
                    }
                    if (buf.length() < 1 || !ok) {
                        // syntaxError(chars, "Invalid multicharacter string");
                        ec = U_MALFORMED_SET;
                        return;
                    }
                }
                // We have new string. Add it to set and continue;
                // we don't need to drop through to the further
                // processing
                add(buf);
                patLocal.append((UChar) 0x7B /*'{'*/);
                _appendToPat(patLocal, buf, FALSE);
                patLocal.append((UChar) 0x7D /*'}'*/);
                continue;
            case SymbolTable::SYMBOL_REF:
                //         symbols  nosymbols
                // [a-$]   error    error (ambiguous)
                // [a$]    anchor   anchor
                // [a-$x]  var "x"* literal '$'
                // [a-$.]  error    literal '$'
                // *We won't get here in the case of var "x"
                {
                    chars.getPos(backup);
                    c = chars.next(opts, literal, ec);
                    if (U_FAILURE(ec)) return;
                    UBool anchor = (c == 0x5D /*']'*/ && !literal);
                    if (symbols == 0 && !anchor) {
                        c = SymbolTable::SYMBOL_REF;
                        chars.setPos(backup);
                        break; // literal '$'
                    }
                    if (anchor && op == 0) {
                        if (lastItem == 1) {
                            add(lastChar, lastChar);
                            _appendToPat(patLocal, lastChar, FALSE);
                        }
                        add(U_ETHER);
                        usePat = TRUE;
                        patLocal.append((UChar) SymbolTable::SYMBOL_REF);
                        patLocal.append((UChar) 0x5D /*']'*/);
                        mode = 2;
                        continue;
                    }
                    // syntaxError(chars, "Unquoted '$'");
                    ec = U_MALFORMED_SET;
                    return;
                }
            default:
                break;
            }
        }

        // -------- Parse literal characters.  This includes both
        // escaped chars ("\u4E01") and non-syntax characters
        // ("a").

        switch (lastItem) {
        case 0:
            lastItem = 1;
            lastChar = c;
            break;
        case 1:
            if (op == HYPHEN /*'-'*/) {
                if (lastChar >= c) {
                    // Don't allow redundant (a-a) or empty (b-a) ranges;
                    // these are most likely typos.
                    // syntaxError(chars, "Invalid range");
                    ec = U_MALFORMED_SET;
                    return;
                }
                add(lastChar, c);
                _appendToPat(patLocal, lastChar, FALSE);
                patLocal.append(op);
                _appendToPat(patLocal, c, FALSE);
                lastItem = 0;
                op = 0;
            } else {
                add(lastChar, lastChar);
                _appendToPat(patLocal, lastChar, FALSE);
                lastChar = c;
            }
            break;
        case 2:
            if (op != 0) {
                // syntaxError(chars, "Set expected after operator");
                ec = U_MALFORMED_SET;
                return;
            }
            lastChar = c;
            lastItem = 1;
            break;
        }
    }

    if (mode != 2) {
        // syntaxError(chars, "Missing ']'");
        ec = U_MALFORMED_SET;
        return;
    }

    chars.skipIgnored(opts);

    /**
     * Handle global flags (invert, case insensitivity).  If this
     * pattern should be compiled case-insensitive, then we need
     * to close over case BEFORE COMPLEMENTING.  This makes
     * patterns like /[^abc]/i work.
     */
    if ((options & USET_CASE_INSENSITIVE) != 0) {
        (this->*caseClosure)(USET_CASE_INSENSITIVE);
    }
    else if ((options & USET_ADD_CASE_MAPPINGS) != 0) {
        (this->*caseClosure)(USET_ADD_CASE_MAPPINGS);
    }
    if (invert) {
        complement();
    }

    // Use the rebuilt pattern (patLocal) only if necessary.  Prefer the
    // generated pattern.
    if (usePat) {
        rebuiltPat.append(patLocal);
    } else {
        _generatePattern(rebuiltPat, FALSE);
    }
    if (isBogus() && U_SUCCESS(ec)) {
        // We likely ran out of memory. AHHH!
        ec = U_MEMORY_ALLOCATION_ERROR;
    }
}